

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

int FMstruct_size_field_list(FMFieldList list,int pointer_size)

{
  char *__s;
  int iVar1;
  long in_RAX;
  char *pcVar2;
  int iVar3;
  int field;
  int iVar4;
  int *piVar5;
  long elements;
  
  field = 0;
  iVar4 = 0;
  elements = in_RAX;
  for (piVar5 = &list->field_offset; ((_FMField *)(piVar5 + -5))->field_name != (char *)0x0;
      piVar5 = piVar5 + 6) {
    iVar1 = is_var_array_field(list,field);
    iVar3 = pointer_size;
    if (iVar1 == 0) {
      __s = *(char **)(piVar5 + -3);
      pcVar2 = strchr(__s,0x2a);
      if (pcVar2 == (char *)0x0) {
        FMarray_str_to_data_type(__s,&elements);
        iVar3 = piVar5[-1] * (int)elements;
      }
    }
    if (iVar4 <= iVar3 + *piVar5) {
      iVar4 = iVar3 + *piVar5;
    }
    field = field + 1;
  }
  return iVar4;
}

Assistant:

extern
int
FMstruct_size_field_list(FMFieldList list, int pointer_size)
{
    int i = 0;
    int struct_size = 0;
    while (list[i].field_name != NULL) {
	int field_size = 0;
	if ((is_var_array_field(list, i) == 1) || (strchr(list[i].field_type, '*'))) {
	    /* variant array, real_field_size is fmformat->pointer_size */
	    field_size = pointer_size;
	} else {
	    long elements;
	    FMarray_str_to_data_type(list[i].field_type, &elements);
	    field_size = list[i].field_size * elements;
	}
	assert(field_size > 0);
	struct_size = Max(struct_size,
			  (list[i].field_offset + field_size));
/*	printf("i=%d field_name=%s field_type=%s struct_size= %d, offset=%d size=%d\n", i, list[i].field_name, list[i].field_type, struct_size, list[i].field_offset, field_size);*/
	i++;
    }
    return struct_size;
}